

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O1

void __thiscall
pele::physics::turbinflow::TurbInflow::add_turb
          (TurbInflow *this,Box *bx,FArrayBox *data,int dcomp,Geometry *geom,Real time,int dir,
          Side *side)

{
  pointer pTVar1;
  undefined8 uVar2;
  int iVar3;
  Box *pBVar4;
  Arena *ar;
  pointer pTVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  pointer pdVar9;
  TurbInflow *pTVar10;
  uint transDir2;
  bool bVar11;
  Vector<double,_std::allocator<double>_> y;
  Vector<double,_std::allocator<double>_> x;
  Box bvalsBox;
  FArrayBox v;
  allocator_type local_119;
  TurbInflow *local_118;
  int local_110;
  int local_10c;
  Vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  Box local_d4;
  undefined8 uStack_b8;
  undefined4 uStack_b0;
  int local_ac [2];
  undefined8 uStack_a4;
  FArrayBox *local_90;
  ulong local_88;
  Real local_80;
  BaseFab<double> local_78;
  
  uVar2 = *(undefined8 *)((bx->smallend).vect + 2);
  local_ac[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
  uStack_a4 = *(undefined8 *)((bx->bigend).vect + 2);
  uStack_b8 = *(undefined8 *)(bx->smallend).vect;
  uStack_b0 = (undefined4)uVar2;
  local_ac[0] = (int)((ulong)uVar2 >> 0x20);
  lVar8 = (long)dir;
  pBVar4 = (Box *)&(geom->domain).bigend;
  if (*side == low) {
    pBVar4 = &geom->domain;
  }
  local_d4.smallend.vect[2] = (pBVar4->smallend).vect[lVar8] + (uint)(*side != low) * 2 + -1;
  local_90 = data;
  local_80 = time;
  *(int *)((long)&uStack_b8 + lVar8 * 4) = local_d4.smallend.vect[2];
  local_ac[lVar8] = local_d4.smallend.vect[2];
  transDir2 = (dir != 2) + 1;
  uVar6 = (ulong)((uint)(dir == 0) * 4);
  local_d4.smallend.vect[0] = *(int *)((long)&uStack_b8 + uVar6);
  local_d4.bigend.vect[0] = *(int *)((long)local_ac + uVar6);
  uVar6 = (ulong)((uint)(dir != 2) * 4 + 4);
  local_d4.smallend.vect[1] = *(int *)((long)&uStack_b8 + uVar6);
  local_d4.bigend.vect[1] = *(int *)((long)local_ac + uVar6);
  local_d4.btype.itype = 0;
  local_118 = this;
  local_110 = dcomp;
  local_d4.bigend.vect[2] = local_d4.smallend.vect[2];
  ar = amrex::The_Async_Arena();
  amrex::FArrayBox::FArrayBox((FArrayBox *)&local_78,&local_d4,3,ar);
  local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
            (&local_78,(double *)&local_f0,&local_78.domain,(DestComp)0x0,(NumComps)local_78.nvar);
  pTVar5 = (local_118->tp).
           super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
           .
           super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (local_118->tp).
           super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
           .
           super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar1 != pTVar5 && -1 < (long)pTVar1 - (long)pTVar5) {
    bVar11 = dir == 0;
    lVar8 = 0;
    pTVar10 = local_118;
    local_10c = dir;
    local_88 = (ulong)(dir == 0);
    do {
      if ((pTVar5[lVar8].dir == dir) && (pTVar5[lVar8].side == *side)) {
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_f0,(long)((local_d4.bigend.vect[0] - local_d4.smallend.vect[0]) + 1),
                   (allocator_type *)&local_108);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_108,
                   (long)((local_d4.bigend.vect[1] - local_d4.smallend.vect[1]) + 1),&local_119);
        if (local_d4.smallend.vect[0] <= local_d4.bigend.vect[0]) {
          pTVar5 = (local_118->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = local_d4.smallend.vect[0];
          do {
            *pdVar9 = (((double)iVar3 + 0.5) * (geom->super_CoordSys).dx[local_88] +
                      (geom->prob_domain).xlo[bVar11]) * *(Real *)((long)(pTVar5 + lVar8) + 200);
            pdVar9 = pdVar9 + 1;
            iVar3 = iVar3 + 1;
          } while (local_d4.bigend.vect[0] + 1 != iVar3);
        }
        if (local_d4.smallend.vect[1] <= local_d4.bigend.vect[1]) {
          pTVar5 = (local_118->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = local_108.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = local_d4.smallend.vect[1];
          do {
            *pdVar9 = (((double)iVar3 + 0.5) * (geom->super_CoordSys).dx[transDir2] +
                      (geom->prob_domain).xlo[transDir2]) * *(Real *)((long)(pTVar5 + lVar8) + 200);
            pdVar9 = pdVar9 + 1;
            iVar3 = iVar3 + 1;
          } while (local_d4.bigend.vect[1] + 1 != iVar3);
        }
        pTVar5 = (local_118->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fill_turb_plane(pTVar5 + lVar8,(Vector<double,_std::allocator<double>_> *)&local_f0,
                        &local_108,
                        (*(Real *)((long)(pTVar5 + lVar8) + 0x98) + local_80) *
                        *(Real *)((long)(pTVar5 + lVar8) + 0xd8) *
                        *(Real *)((long)(pTVar5 + lVar8) + 200),(FArrayBox *)&local_78);
        if (local_108.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start != (double *)0x0) {
          operator_delete(local_108.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pTVar10 = local_118;
        dir = local_10c;
        if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
          pTVar10 = local_118;
          dir = local_10c;
        }
      }
      lVar8 = lVar8 + 1;
      pTVar5 = (pTVar10->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = ((long)(pTVar10->tp).
                     super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                     .
                     super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 4) *
              -0xf0f0f0f0f0f0f0f;
    } while (lVar7 - lVar8 != 0 && lVar8 <= lVar7);
  }
  set_turb(dir,(uint)(dir == 0),transDir2,(FArrayBox *)&local_78,local_90,local_110);
  local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
  amrex::BaseFab<double>::clear(&local_78);
  return;
}

Assistant:

void
TurbInflow::add_turb(
  amrex::Box const& bx,
  amrex::FArrayBox& data,
  const int dcomp,
  amrex::Geometry const& geom,
  const amrex::Real time,
  const int dir,
  const amrex::Orientation::Side& side)
{
  AMREX_ASSERT(turbinflow_initialized);

  // Box on which we will access data
  amrex::Box bvalsBox = bx;
  int planeLoc =
    (side == amrex::Orientation::low ? geom.Domain().smallEnd()[dir] - 1
                                     : geom.Domain().bigEnd()[dir] + 1);
  bvalsBox.setSmall(dir, planeLoc);
  bvalsBox.setBig(dir, planeLoc);

  // Define box that we will fill with turb: need to be z-normal
  // Get transverse directions
  int tdir1 = (dir != 0) ? 0 : 1;
  int tdir2 = (dir != 0) ? ((dir == 2) ? 1 : 2) : 2;
  int tr1Lo = bvalsBox.smallEnd()[tdir1];
  int tr1Hi = bvalsBox.bigEnd()[tdir1];
  int tr2Lo = bvalsBox.smallEnd()[tdir2];
  int tr2Hi = bvalsBox.bigEnd()[tdir2];
  const amrex::IntVect lo(AMREX_D_DECL(tr1Lo, tr2Lo, planeLoc));
  const amrex::IntVect hi(AMREX_D_DECL(tr1Hi, tr2Hi, planeLoc));
  amrex::Box turbBox(lo, hi);
  amrex::FArrayBox v(turbBox, 3, amrex::The_Async_Arena());
  v.setVal<amrex::RunOn::Device>(0);

  // Add turbulence from all the tp acting on this face
  for (int n = 0; n < tp.size(); n++) {

    if (tp[n].dir == dir && tp[n].side == side) {

      // 0 and 1 are the two transverse directions
      amrex::Vector<amrex::Real> x(turbBox.size()[0]), y(turbBox.size()[1]);
      for (int i = turbBox.smallEnd()[0]; i <= turbBox.bigEnd()[0]; ++i) {
        x[i - turbBox.smallEnd()[0]] =
          (geom.ProbLo()[tdir1] + (i + 0.5) * geom.CellSize(tdir1)) *
          tp[n].turb_scale_loc;
      }
      for (int j = turbBox.smallEnd()[1]; j <= turbBox.bigEnd()[1]; ++j) {
        y[j - turbBox.smallEnd()[1]] =
          (geom.ProbLo()[tdir2] + (j + 0.5) * geom.CellSize(tdir2)) *
          tp[n].turb_scale_loc;
      }

      // Get the turbulence
      amrex::Real z =
        (time + tp[n].time_shift) * tp[n].turb_conv_vel * tp[n].turb_scale_loc;
      fill_turb_plane(tp[n], x, y, z, v);
    }
  }

  // Moving it into data
  set_turb(dir, tdir1, tdir2, v, data, dcomp);

#if 0
  std::string junk = "TurbV_AftTP"+std::to_string(n)+"_D";
  std::ofstream os;
  os.precision(15);
  os.open(junk.c_str());
  data.writeOn(os);
  os.close();
  amrex::Abort();
#endif
}